

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddConfigVariableFlags
          (cmLocalGenerator *this,string *flags,string *var,string *config)

{
  char *pcVar1;
  string flagsVar;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_60,(string *)var);
  pcVar1 = cmMakefile::GetDefinition(this->Makefile,&local_60);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar1);
  if (config->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_60);
    cmsys::SystemTools::UpperCase(&local_40,config);
    std::__cxx11::string::append((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    pcVar1 = cmMakefile::GetDefinition(this->Makefile,&local_60);
    (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar1);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void cmLocalGenerator::AddConfigVariableFlags(std::string& flags,
                                              const std::string& var,
                                              const std::string& config)
{
  // Add the flags from the variable itself.
  std::string flagsVar = var;
  this->AppendFlags(flags, this->Makefile->GetDefinition(flagsVar));
  // Add the flags from the build-type specific variable.
  if(!config.empty())
    {
    flagsVar += "_";
    flagsVar += cmSystemTools::UpperCase(config);
    this->AppendFlags(flags, this->Makefile->GetDefinition(flagsVar));
    }
}